

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::handle_peer_resp(raft_server *this,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  int32 iVar1;
  uint uVar2;
  element_type *peVar3;
  long lVar4;
  element_type *peVar5;
  bool bVar6;
  msg_type mVar7;
  int iVar8;
  iterator iVar9;
  undefined8 uVar10;
  msg_type type;
  msg_type type_00;
  element_type *peVar11;
  Param *this_00;
  Param param;
  int32 peer_id;
  ptr<peer> pp;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_48;
  unique_lock<std::recursive_mutex> guard;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
  peVar3 = (err->super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)&param,
               &(peVar3->req_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>);
    iVar1 = *(int32 *)(CONCAT44(param.leaderId,param.myId) + 0x18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&param.peerId);
    pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peer_id = iVar1;
    iVar9 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,&peer_id);
    if (iVar9.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar9.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        ._M_cur + 0x10));
    }
    if (pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      iVar8 = 0;
    }
    else {
      LOCK();
      ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->rpc_errs_).
      super___atomic_base<int>._M_i =
           ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->rpc_errs_).
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      iVar8 = ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->rpc_errs_).
              super___atomic_base<int>._M_i;
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_48,&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
      check_snapshot_timeout(this,(ptr<peer> *)&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    }
    if (iVar8 < DAT_0018452c) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 != (element_type *)0x0) &&
         (iVar8 = (*peVar5->_vptr_logger[7])(), iVar1 = peer_id, 2 < iVar8)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar10 = (**(code **)(*(long *)(err->
                                       super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + 0x10))();
        msg_if_given_abi_cxx11_
                  ((string *)&param,"peer (%d) response error: %s",(ulong)(uint)iVar1,uVar10);
        (*peVar5->_vptr_logger[8])
                  (peVar5,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_peer_resp",0x31e,&param);
LAB_00147158:
        std::__cxx11::string::~string((string *)&param);
      }
    }
    else if (((iVar8 == DAT_0018452c) &&
             (peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr, peVar5 != (element_type *)0x0)) &&
            (iVar8 = (*peVar5->_vptr_logger[7])(), 2 < iVar8)) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&param,"too verbose RPC error on peer (%d), will suppress it from now",
                 (ulong)(uint)peer_id);
      (*peVar5->_vptr_logger[8])
                (peVar5,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_peer_resp",0x321,&param);
      goto LAB_00147158;
    }
    if ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) &&
       ((((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->leave_requested_
         )._M_base._M_i & 1U) != 0)) {
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_58,&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
      handle_join_leave_rpc_err(this,leave_cluster_request,(ptr<peer> *)&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    goto LAB_001471aa;
  }
  peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    if (peVar5 != (element_type *)0x0) {
      iVar8 = (*peVar5->_vptr_logger[7])();
      if (4 < iVar8) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_type_to_string_abi_cxx11_
                  ((string *)&pp,
                   (nuraft *)
                   (ulong)(((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr)->super_msg_base).type_,type);
        peVar11 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&param,
                   "Receive a %s message from peer %d with Result=%d, Term=%lu, NextIndex=%lu",
                   pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (ulong)(uint)(peVar11->super_msg_base).src_,(ulong)peVar11->accepted_,
                   (peVar11->super_msg_base).term_,peVar11->next_idx_);
        (*peVar5->_vptr_logger[8])
                  (peVar5,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_peer_resp",0x337,&param);
        std::__cxx11::string::~string((string *)&param);
        std::__cxx11::string::~string((string *)&pp);
      }
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 != (element_type *)0x0) && (iVar8 = (*peVar5->_vptr_logger[7])(), 5 < iVar8)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar11 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&param,"src: %d, dst: %d, resp->get_term(): %d\n",
                   (ulong)(uint)(peVar11->super_msg_base).src_,
                   (ulong)(uint)(peVar11->super_msg_base).dst_,
                   (ulong)(uint)(peVar11->super_msg_base).term_);
        (*peVar5->_vptr_logger[8])
                  (peVar5,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_peer_resp",0x33a,&param);
        std::__cxx11::string::~string((string *)&param);
      }
    }
    peVar11 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar11->accepted_ == true) {
      param.myId = (peVar11->super_msg_base).src_;
      iVar9 = std::
              _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->peers_)._M_h,&param.myId);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
          _M_cur != (__node_type *)0x0) {
        lVar4 = *(long *)((long)iVar9.
                                super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                ._M_cur + 0x10);
        uVar2 = *(uint *)(lVar4 + 0x1cc);
        if (((DAT_0018452c <= (int)uVar2) &&
            (peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr, peVar5 != (element_type *)0x0)) &&
           (iVar8 = (*peVar5->_vptr_logger[7])(), 2 < iVar8)) {
          peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&param,"recovered from RPC failure from peer %d, %d errors",
                     (ulong)(uint)(((resp->
                                    super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->super_msg_base).src_,(ulong)uVar2);
          (*peVar5->_vptr_logger[8])
                    (peVar5,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_peer_resp",0x344,&param);
          std::__cxx11::string::~string((string *)&param);
        }
        LOCK();
        *(undefined4 *)(lVar4 + 0x1cc) = 0;
        UNLOCK();
        timer_helper::reset((timer_helper *)(lVar4 + 0x140));
      }
    }
    peVar11 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    mVar7 = (peVar11->super_msg_base).type_;
    if (mVar7 - request_vote_request < 0x17) {
      bVar6 = update_term(this,(peVar11->super_msg_base).term_);
      if (bVar6) goto LAB_001471aa;
      peVar11 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      mVar7 = (peVar11->super_msg_base).type_;
    }
    switch(mVar7) {
    case install_snapshot_response:
      handle_install_snapshot_resp(this,peVar11);
      break;
    case ping_response:
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 == (element_type *)0x0) || (iVar8 = (*peVar5->_vptr_logger[7])(), iVar8 < 4))
      break;
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&param,"got ping response from %d",
                 (ulong)(uint)(((resp->
                                super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->super_msg_base).src_);
      (*peVar5->_vptr_logger[8])
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_peer_resp",0x36e,&param);
      goto LAB_00147213;
    case pre_vote_response:
      handle_prevote_resp(this,peVar11);
      break;
    case priority_change_response:
      handle_priority_change_resp(this,peVar11);
      break;
    default:
      if (mVar7 == request_vote_response) {
        handle_vote_resp(this,peVar11);
        break;
      }
      if (mVar7 == append_entries_response) {
        param.myId = this->id_;
        param.leaderId = (this->leader_).super___atomic_base<int>._M_i;
        param.ctx = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        param.peerId = (((element_type *)param.ctx)->super_msg_base).src_;
        cb_func::call(&((this->ctx_)._M_t.
                        super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                        .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                      ReceivedAppendEntriesResp,&param);
        handle_append_entries_resp
                  (this,(resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
        break;
      }
      if (mVar7 == custom_notification_response) {
        handle_custom_notification_resp(this,peVar11);
        break;
      }
    case ping_request:
    case pre_vote_request:
    case other_request:
    case other_response:
    case priority_change_request:
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 != (element_type *)0x0) && (iVar8 = (*peVar5->_vptr_logger[7])(), 1 < iVar8)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_type_to_string_abi_cxx11_
                  ((string *)&pp,
                   (nuraft *)
                   (ulong)(((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr)->super_msg_base).type_,type_00);
        msg_if_given_abi_cxx11_
                  ((string *)&param,"received an unexpected response: %s, ignore it",
                   pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        (*peVar5->_vptr_logger[8])
                  (peVar5,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_peer_resp",0x377,&param);
        std::__cxx11::string::~string((string *)&param);
        this_00 = (Param *)&pp;
LAB_00147218:
        std::__cxx11::string::~string((string *)this_00);
      }
    }
LAB_001471aa:
    std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
    return;
  }
  if ((peVar5 == (element_type *)0x0) || (iVar8 = (*peVar5->_vptr_logger[7])(), iVar8 < 3))
  goto LAB_001471aa;
  peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  msg_if_given_abi_cxx11_((string *)&param,"empty peer response");
  (*peVar5->_vptr_logger[8])
            (peVar5,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
             ,"handle_peer_resp",0x32d,&param);
LAB_00147213:
  this_00 = &param;
  goto LAB_00147218;
}

Assistant:

void raft_server::handle_peer_resp(ptr<resp_msg>& resp, ptr<rpc_exception>& err) {
    recur_lock(lock_);
    if (err) {
        int32 peer_id = err->req()->get_dst();
        ptr<peer> pp = nullptr;
        auto entry = peers_.find(peer_id);
        if (entry != peers_.end()) pp = entry->second;

        int rpc_errs = 0;
        if (pp) {
            pp->inc_rpc_errs();
            rpc_errs = pp->get_rpc_errs();

            check_snapshot_timeout(pp);
        }

        if (rpc_errs < raft_server::raft_limits_.warning_limit_) {
            p_wn("peer (%d) response error: %s", peer_id, err->what());
        } else if (rpc_errs == raft_server::raft_limits_.warning_limit_) {
            p_wn("too verbose RPC error on peer (%d), "
                 "will suppress it from now", peer_id);
        }

        if (pp && pp->is_leave_flag_set()) {
            // If this is to-be-removed server, proceed it without
            // waiting for the response.
            handle_join_leave_rpc_err(msg_type::leave_cluster_request, pp);
        }
        return;
    }

    if (!resp.get()) {
        p_wn("empty peer response");
        return;
    }

    p_db( "Receive a %s message from peer %d with "
          "Result=%d, Term=%" PRIu64 ", NextIndex=%" PRIu64 "",
          msg_type_to_string(resp->get_type()).c_str(),
          resp->get_src(),
          resp->get_accepted() ? 1 : 0,
          resp->get_term(),
          resp->get_next_idx() );

    p_tr("src: %d, dst: %d, resp->get_term(): %d\n",
         (int)resp->get_src(), (int)resp->get_dst(), (int)resp->get_term());

    if (resp->get_accepted()) {
        // On accepted response, reset response timer.
        auto entry = peers_.find(resp->get_src());
        if (entry != peers_.end()) {
            peer* pp = entry->second.get();
            int rpc_errs = pp->get_rpc_errs();
            if (rpc_errs >= raft_server::raft_limits_.warning_limit_) {
                p_wn("recovered from RPC failure from peer %d, %d errors",
                     resp->get_src(), rpc_errs);
            }
            pp->reset_rpc_errs();
            pp->reset_resp_timer();
        }
    }

    if ( is_valid_msg(resp->get_type()) ) {
        bool update_term_succ = update_term(resp->get_term());

        // if term is updated, no more action is required
        if (update_term_succ) return;
    }

    // ignore the response that with lower term for safety
    switch (resp->get_type())
    {
    case msg_type::pre_vote_response:
        handle_prevote_resp(*resp);
        break;

    case msg_type::request_vote_response:
        handle_vote_resp(*resp);
        break;

    case msg_type::append_entries_response:
        {
            cb_func::Param param(id_, leader_, resp->get_src(), resp.get());
            ctx_->cb_func_.call(cb_func::ReceivedAppendEntriesResp, &param);
        }
        handle_append_entries_resp(*resp);
        break;

    case msg_type::install_snapshot_response:
        handle_install_snapshot_resp(*resp);
        break;

    case msg_type::priority_change_response:
        handle_priority_change_resp(*resp);
        break;

    case msg_type::ping_response:
        p_in("got ping response from %d", resp->get_src());
        break;

    case msg_type::custom_notification_response:
        handle_custom_notification_resp(*resp);
        break;

    default:
        p_er( "received an unexpected response: %s, ignore it",
              msg_type_to_string(resp->get_type()).c_str() );
        break;
    }
}